

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

Object_Key_Store_Data * Object_Key_Store_Data::Narrow(Am_Wrapper *value)

{
  uint uVar1;
  Am_Wrapper *value_local;
  
  if ((value == (Am_Wrapper *)0x0) ||
     (uVar1 = (**(value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(), value_local = value,
     (uVar1 & 0xffff) != (uint)id)) {
    value_local = (Am_Wrapper *)0x0;
  }
  return (Object_Key_Store_Data *)value_local;
}

Assistant:

static Am_Value
from_object_procedure(Am_Object & /*self*/)
{
  Am_Value value;
  Object_Key_Store_Data *store =
      (Object_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = (store->object).Get(store->key);
  store->Release();
  return value;
}